

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O1

Exception * kj::_::XThreadPaf::unfulfilledException(void)

{
  char *pcVar1;
  size_t sVar2;
  Exception *in_RDI;
  String local_28;
  
  heapString(&local_28,"cross-thread PromiseFulfiller was destroyed without fulfilling the promise."
             ,0x4b);
  Exception::Exception
            (in_RDI,FAILED,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x4e5,&local_28);
  sVar2 = local_28.content.size_;
  pcVar1 = local_28.content.ptr;
  if (local_28.content.ptr != (char *)0x0) {
    local_28.content.ptr = (char *)0x0;
    local_28.content.size_ = 0;
    (*(code *)**(undefined8 **)local_28.content.disposer)
              (local_28.content.disposer,pcVar1,1,sVar2,sVar2,0);
  }
  return in_RDI;
}

Assistant:

kj::Exception XThreadPaf::unfulfilledException() {
  // TODO(cleanup): Share code with regular PromiseAndFulfiller for stack tracing here.
  return kj::Exception(kj::Exception::Type::FAILED, __FILE__, __LINE__, kj::heapString(
      "cross-thread PromiseFulfiller was destroyed without fulfilling the promise."));
}